

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall kj::Vector<char32_t>::setCapacity(Vector<char32_t> *this,size_t newSize)

{
  char32_t *pcVar1;
  char32_t *pcVar2;
  RemoveConst<char32_t> *pRVar3;
  char32_t *__dest;
  ulong __n;
  ArrayBuilder<char32_t> newBuilder;
  ArrayBuilder<char32_t> local_38;
  
  pcVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)pcVar1 >> 2)) {
    (this->builder).pos = pcVar1 + newSize;
  }
  __dest = (char32_t *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (4,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = __dest + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pcVar1 = (this->builder).ptr;
  pcVar2 = (this->builder).pos;
  local_38.ptr = __dest;
  if (pcVar1 != pcVar2) {
    __n = (long)pcVar2 - (long)pcVar1 & 0xfffffffffffffffc;
    local_38.pos = __dest;
    memcpy(__dest,pcVar1,__n);
    __dest = (char32_t *)((long)__dest + __n);
  }
  local_38.pos = __dest;
  ArrayBuilder<char32_t>::operator=(&this->builder,&local_38);
  pcVar2 = local_38.endPtr;
  pRVar3 = local_38.pos;
  pcVar1 = local_38.ptr;
  if (local_38.ptr != (char32_t *)0x0) {
    local_38.ptr = (char32_t *)0x0;
    local_38.pos = (RemoveConst<char32_t> *)0x0;
    local_38.endPtr = (char32_t *)0x0;
    (*(code *)**(undefined8 **)local_38.disposer)
              (local_38.disposer,pcVar1,4,(long)pRVar3 - (long)pcVar1 >> 2,
               (long)pcVar2 - (long)pcVar1 >> 2,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }